

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int select_key_share(ptls_key_exchange_algorithm_t **selected,ptls_iovec_t *peer_key,
                    ptls_key_exchange_algorithm_t **candidates,uint8_t **src,uint8_t *end,
                    int expect_one)

{
  ptls_key_exchange_algorithm_t *ppVar1;
  ptls_key_exchange_algorithm_t **pppVar2;
  int iVar3;
  uint16_t group;
  ptls_iovec_t key;
  uint16_t local_42;
  ptls_iovec_t local_40;
  
  *selected = (ptls_key_exchange_algorithm_t *)0x0;
  if (*src != end) {
    do {
      iVar3 = decode_key_share_entry(&local_42,&local_40,src,end);
      if (iVar3 != 0) {
        return iVar3;
      }
      ppVar1 = *candidates;
      pppVar2 = candidates + 1;
      while (ppVar1 != (ptls_key_exchange_algorithm_t *)0x0) {
        if ((*selected == (ptls_key_exchange_algorithm_t *)0x0) && (ppVar1->id == local_42)) {
          *selected = ppVar1;
          peer_key->base = local_40.base;
          peer_key->len = local_40.len;
        }
        ppVar1 = *pppVar2;
        pppVar2 = pppVar2 + 1;
      }
    } while (*src != end);
  }
  return 0;
}

Assistant:

static int select_key_share(ptls_key_exchange_algorithm_t **selected, ptls_iovec_t *peer_key,
                            ptls_key_exchange_algorithm_t **candidates, const uint8_t **src, const uint8_t *const end,
                            int expect_one)
{
    int ret;

    *selected = NULL;

    if (expect_one && *src == end) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    while (*src != end) {
        uint16_t group;
        ptls_iovec_t key;
        if ((ret = decode_key_share_entry(&group, &key, src, end)) != 0)
            goto Exit;
        ptls_key_exchange_algorithm_t **c = candidates;
        for (; *c != NULL; ++c) {
            if (*selected == NULL && (*c)->id == group) {
                *selected = *c;
                *peer_key = key;
            }
        }
        if (expect_one) {
            ret = *selected != NULL ? 0 : PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    return ret;
}